

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O3

void test_resampler_duplex<float>
               (uint32_t input_channels,uint32_t output_channels,uint32_t input_rate,
               uint32_t output_rate,uint32_t target_rate,float chunk_duration)

{
  uint32_t uVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  float *pfVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  size_t length;
  float fVar9;
  float fVar10;
  auto_array<float> local_120;
  ulong local_108;
  uint32_t local_fc;
  cubeb_resampler *local_f8;
  long input_consumed;
  auto_array<float> expected_resampled_input;
  osc_state state;
  auto_array<float> expected_resampled_output;
  cubeb_stream_params output_params;
  cubeb_stream_params input_params;
  
  pfVar5 = (float *)0x0;
  state.input_phase_index = 0;
  state.output_phase_index = 0;
  state.output_offset = 0;
  state.input.data_ = (float *)0x0;
  state.input.capacity_ = 0;
  state.input.length_ = 0;
  state.output.data_ = (float *)0x0;
  state.output.capacity_ = 0;
  state.output.length_ = 0;
  output_params.format = CUBEB_SAMPLE_FLOAT32LE;
  input_params.format = CUBEB_SAMPLE_FLOAT32LE;
  output_params.prefs = CUBEB_STREAM_PREF_NONE;
  input_params.prefs = CUBEB_STREAM_PREF_NONE;
  state.input_channels = input_channels;
  state.output_channels = output_channels;
  state.output_rate = output_rate;
  state.target_rate = target_rate;
  output_params.rate = output_rate;
  output_params.channels = output_channels;
  input_params.rate = input_rate;
  input_params.channels = input_channels;
  local_f8 = cubeb_resampler_create
                       ((cubeb_stream *)0x0,&input_params,&output_params,target_rate,
                        data_cb_resampler,&state,CUBEB_RESAMPLER_QUALITY_VOIP,
                        CUBEB_RESAMPLER_RECLOCK_NONE);
  lVar3 = cubeb_resampler_latency(local_f8);
  local_108 = CONCAT44(local_108._4_4_,(float)input_rate);
  local_fc = input_rate;
  fVar9 = ceilf(((float)input_rate * chunk_duration) / 1000.0);
  fVar10 = ceilf((float)local_108 / (float)target_rate);
  uVar7 = (ulong)(fVar10 + fVar10 + fVar9);
  uVar4 = (ulong)(((float)output_rate * chunk_duration) / 1000.0);
  iVar6 = (int)uVar7;
  if (iVar6 * input_channels == 0) {
    uVar8 = 0;
  }
  else {
    uVar8 = (ulong)(iVar6 * input_channels);
    pfVar5 = (float *)operator_new__(uVar8 * 4);
  }
  uVar1 = target_rate * 2;
  local_120.length_ = 0;
  uVar2 = (int)uVar4 * output_channels;
  local_120.data_ = pfVar5;
  local_120.capacity_ = uVar8;
  local_108 = (ulong)target_rate;
  if (uVar2 == 0) {
    pfVar5 = (float *)0x0;
  }
  else {
    pfVar5 = (float *)operator_new__((ulong)uVar2 << 2);
  }
  uVar8 = (ulong)(uVar1 * input_channels);
  if (uVar1 * input_channels == 0) {
    expected_resampled_input.capacity_ = 0;
    expected_resampled_input.data_ = (float *)0x0;
  }
  else {
    expected_resampled_input.data_ = (float *)operator_new__(uVar8 * 4);
    expected_resampled_input.capacity_ = uVar8;
  }
  expected_resampled_input.length_ = 0;
  uVar2 = output_channels * output_rate * 2;
  if (uVar2 == 0) {
    length = 0;
    expected_resampled_output.data_ = (float *)0x0;
  }
  else {
    length = (size_t)uVar2;
    expected_resampled_output.data_ = (float *)operator_new__(length * 4);
  }
  expected_resampled_output.length_ = 0;
  state.max_output_phase_index = uVar1;
  expected_resampled_output.capacity_ = length;
  auto_array<float>::push_silence(&expected_resampled_input,uVar8);
  auto_array<float>::push_silence(&expected_resampled_output,length);
  fill_with_sine(expected_resampled_input.data_ + lVar3,(uint32_t)local_108,input_channels,
                 uVar1 - (int)lVar3,0);
  fill_with_sine(expected_resampled_output.data_ + lVar3,output_rate,output_channels,
                 output_rate * 2 - (int)lVar3,0);
  if (state.output_phase_index != state.max_output_phase_index) {
    uVar7 = uVar7 & 0xffffffff;
    do {
      uVar2 = (int)local_120.length_ * input_channels;
      auto_array<float>::reserve(&local_120,uVar7);
      state.input_phase_index =
           fill_with_sine(local_120.data_ + uVar2,local_fc,input_channels,iVar6 - uVar2,
                          state.input_phase_index);
      local_120.length_ = uVar7;
      input_consumed = uVar7;
      lVar3 = cubeb_resampler_fill
                        (local_f8,local_120.data_,&input_consumed,pfVar5,uVar4 & 0xffffffff);
      if (iVar6 == (int)input_consumed) {
        local_120.length_ = 0;
      }
      else {
        uVar8 = input_consumed * (ulong)input_channels;
        if (uVar8 <= local_120.length_) {
          memmove(local_120.data_,local_120.data_ + uVar8,(local_120.length_ - uVar8) * 4);
          local_120.length_ = local_120.length_ - uVar8;
        }
      }
      auto_array<float>::push(&state.output,pfVar5,lVar3 * (ulong)state.output_channels);
    } while (state.output_phase_index != state.max_output_phase_index);
  }
  dump<float>("input_expected.raw",expected_resampled_input.data_,expected_resampled_input.length_);
  dump<float>("output_expected.raw",expected_resampled_output.data_,
              expected_resampled_output.length_);
  dump<float>("input.raw",state.input.data_,state.input.length_);
  dump<float>("output.raw",state.output.data_,state.output.length_);
  cubeb_resampler_destroy(local_f8);
  if (expected_resampled_output.data_ != (float *)0x0) {
    operator_delete__(expected_resampled_output.data_);
  }
  if (expected_resampled_input.data_ != (float *)0x0) {
    operator_delete__(expected_resampled_input.data_);
  }
  if (pfVar5 != (float *)0x0) {
    operator_delete__(pfVar5);
  }
  if (local_120.data_ != (float *)0x0) {
    operator_delete__(local_120.data_);
  }
  if (state.output.data_ != (float *)0x0) {
    operator_delete__(state.output.data_);
  }
  if (state.input.data_ != (float *)0x0) {
    operator_delete__(state.input.data_);
  }
  return;
}

Assistant:

void test_resampler_duplex(uint32_t input_channels, uint32_t output_channels,
                           uint32_t input_rate, uint32_t output_rate,
                           uint32_t target_rate, float chunk_duration)
{
  cubeb_stream_params input_params;
  cubeb_stream_params output_params;
  osc_state state;

  input_params.format = output_params.format = cubeb_format<T>();
  state.input_channels = input_params.channels = input_channels;
  state.output_channels = output_params.channels = output_channels;
  input_params.rate = input_rate;
  state.output_rate = output_params.rate = output_rate;
  state.target_rate = target_rate;
  input_params.prefs = output_params.prefs = CUBEB_STREAM_PREF_NONE;
  long got;

  cubeb_resampler * resampler =
    cubeb_resampler_create((cubeb_stream*)nullptr, &input_params, &output_params, target_rate,
                           data_cb_resampler, (void*)&state, CUBEB_RESAMPLER_QUALITY_VOIP,
                           CUBEB_RESAMPLER_RECLOCK_NONE);

  long latency = cubeb_resampler_latency(resampler);

  const uint32_t duration_s = 2;
  int32_t duration_frames = duration_s * target_rate;
  uint32_t input_array_frame_count = ceil(chunk_duration * input_rate / 1000) + ceilf(static_cast<float>(input_rate) / target_rate) * 2;
  uint32_t output_array_frame_count = chunk_duration * output_rate / 1000;
  auto_array<float> input_buffer(input_channels * input_array_frame_count);
  auto_array<float> output_buffer(output_channels * output_array_frame_count);
  auto_array<float> expected_resampled_input(input_channels * duration_frames);
  auto_array<float> expected_resampled_output(output_channels * output_rate * duration_s);

  state.max_output_phase_index = duration_s * target_rate;

  expected_resampled_input.push_silence(input_channels * duration_frames);
  expected_resampled_output.push_silence(output_channels * output_rate * duration_s);

  /* expected output is a 440Hz sine wave at 16kHz */
  fill_with_sine(expected_resampled_input.data() + latency,
                 target_rate, input_channels, duration_frames - latency, 0);
  /* expected output is a 440Hz sine wave at 32kHz */
  fill_with_sine(expected_resampled_output.data() + latency,
                 output_rate, output_channels, output_rate * duration_s - latency, 0);

  while (state.output_phase_index != state.max_output_phase_index) {
    uint32_t leftover_samples = input_buffer.length() * input_channels;
    input_buffer.reserve(input_array_frame_count);
    state.input_phase_index = fill_with_sine(input_buffer.data() + leftover_samples,
                                             input_rate,
                                             input_channels,
                                             input_array_frame_count - leftover_samples,
                                             state.input_phase_index);
    long input_consumed = input_array_frame_count;
    input_buffer.set_length(input_array_frame_count);

    got = cubeb_resampler_fill(resampler,
                               input_buffer.data(), &input_consumed,
                               output_buffer.data(), output_array_frame_count);

    /* handle leftover input */
    if (input_array_frame_count != static_cast<uint32_t>(input_consumed)) {
      input_buffer.pop(nullptr, input_consumed * input_channels);
    } else {
      input_buffer.clear();
    }

    state.output.push(output_buffer.data(), got * state.output_channels);
  }

  dump("input_expected.raw", expected_resampled_input.data(), expected_resampled_input.length());
  dump("output_expected.raw", expected_resampled_output.data(), expected_resampled_output.length());
  dump("input.raw", state.input.data(), state.input.length());
  dump("output.raw", state.output.data(), state.output.length());

 // This is disabled because the latency estimation in the resampler code is
 // slightly off so we can generate expected vectors.
 // See https://github.com/kinetiknz/cubeb/issues/93
 // ASSERT_TRUE(array_fuzzy_equal(state.input, expected_resampled_input, epsilon<T>(input_rate/target_rate)));
 // ASSERT_TRUE(array_fuzzy_equal(state.output, expected_resampled_output, epsilon<T>(output_rate/target_rate)));

  cubeb_resampler_destroy(resampler);
}